

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::ListFieldsMayFailOnStripped
          (Reflection *this,Message *message,bool should_fail,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  ReflectionSchema *this_00;
  pointer *pppFVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  FieldDescriptor *pFVar8;
  FieldDescriptor *pFVar9;
  bool bVar10;
  uint32_t uVar11;
  int iVar12;
  LogMessage *other;
  ulong uVar13;
  iterator __position;
  pointer ppFVar14;
  uint32_t *puVar15;
  long lVar16;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar17;
  FieldDescriptor *field;
  FieldDescriptor *local_80;
  uint32_t *local_78;
  ReflectionSchema *local_70;
  LogMessage local_68;
  
  ppFVar14 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar14) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar14;
  }
  if ((this->schema_).default_instance_ != message) {
    this_00 = &this->schema_;
    local_70 = this_00;
    if ((this->schema_).has_bits_offset_ == -1) {
      local_78 = (uint32_t *)0x0;
    }
    else {
      if ((this->schema_).has_bits_offset_ == -1) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x970);
        other = internal::LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_80,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
      uVar11 = internal::ReflectionSchema::HasBitsOffset(this_00);
      local_78 = (uint32_t *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar11)
      ;
    }
    puVar15 = (this->schema_).has_bit_indices_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 4));
    uVar3 = this->last_non_weak_field_index_;
    if (-1 < (int)uVar3) {
      lVar16 = 0;
      do {
        lVar5 = *(long *)(this->descriptor_ + 0x28);
        local_80 = (FieldDescriptor *)(lVar5 + lVar16);
        bVar2 = *(byte *)(lVar5 + 1 + lVar16);
        if ((~bVar2 & 0x60) == 0) {
          iVar12 = FieldSize(this,message,local_80);
          if (0 < iVar12) {
LAB_00398822:
            __position._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0039883b:
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)output,__position,&local_80);
            }
            else {
              *__position._M_current = local_80;
LAB_00398834:
              pppFVar1 = &(output->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
            }
          }
        }
        else {
          lVar6 = *(long *)(lVar5 + 0x28 + lVar16);
          if ((((bVar2 & 0x10) == 0) || (lVar6 == 0)) ||
             ((*(int *)(lVar6 + 4) == 1 && ((*(byte *)(*(long *)(lVar6 + 0x20) + 1) & 2) != 0)))) {
            if ((local_78 == (uint32_t *)0x0) || (*puVar15 == 0xffffffff)) {
              bVar10 = HasBit(this,message,local_80);
            }
            else {
              bVar10 = anon_unknown_0::IsIndexInHasBitSet(local_78,*puVar15);
            }
            if (bVar10 != false) goto LAB_00398822;
          }
          else if ((ulong)*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                   (long)((int)((ulong)(lVar6 - *(long *)(*(long *)(lVar6 + 0x10) +
                                                                         0x30)) >> 3) * -0x33333333)
                                   * 4 + (ulong)(uint)(this->schema_).oneof_case_offset_) ==
                   (long)*(int *)(lVar5 + 4 + lVar16)) {
            __position._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0039883b;
            *__position._M_current = local_80;
            goto LAB_00398834;
          }
        }
        puVar15 = puVar15 + 1;
        lVar16 = lVar16 + 0x48;
      } while ((ulong)uVar3 * 0x48 + 0x48 != lVar16);
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar11 = internal::ReflectionSchema::GetExtensionSetOffset(local_70);
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar11),
                 this->descriptor_,this->descriptor_pool_,output);
    }
    ppFVar14 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar7 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar14 != ppFVar7) {
      uVar13 = (long)ppFVar7 - (long)ppFVar14 >> 3;
      lVar16 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar14,ppFVar7,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar7 - (long)ppFVar14 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar14,ppFVar7);
      }
      else {
        ppFVar17 = ppFVar14 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar14,ppFVar17);
        for (; ppFVar17 != ppFVar7; ppFVar17 = ppFVar17 + 1) {
          pFVar8 = ppFVar17[-1];
          pFVar9 = *ppFVar17;
          iVar4 = *(int *)(pFVar9 + 4);
          iVar12 = *(int *)(pFVar8 + 4);
          ppFVar14 = ppFVar17;
          while (iVar4 < iVar12) {
            *ppFVar14 = pFVar8;
            pFVar8 = ppFVar14[-2];
            ppFVar14 = ppFVar14 + -1;
            iVar12 = *(int *)(pFVar8 + 4);
          }
          *ppFVar14 = pFVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFieldsMayFailOnStripped(
    const Message& message, bool should_fail,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!should_fail && schema_.IsFieldStripped(field)) {
      continue;
    }
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          output->push_back(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        CheckInvalidAccess(schema_, field);
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}